

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::FillScopeObject
              (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var frameObj,
              Var *paramAddr,PropertyIdArray *propIds,HeapArgumentsObject *argsObj,
              ScriptContext *scriptContext,bool nonSimpleParamList,bool useCachedScope)

{
  DynamicTypeHandler *newTypeHandler;
  code *pcVar1;
  BOOL BVar2;
  undefined4 *puVar3;
  JavascriptGeneratorFunction *pJVar4;
  FunctionBody *pFVar5;
  DynamicType *type;
  Var pvVar6;
  ES5HeapArgumentsObject *pEVar7;
  uint uVar8;
  ulong uVar9;
  Var *ppvVar10;
  Type TVar11;
  GeneratorVirtualScriptFunction *this;
  ulong uVar12;
  Type *pTVar13;
  bool bVar14;
  
  if (frameObj == (Var)0x0 && formalsCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                 ,0x1d31,"(formalsCount == 0 || frameObj != nullptr)",
                                 "formalsCount == 0 || frameObj != nullptr");
    if (!bVar14) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  else if (formalsCount == 0) goto LAB_00ab9db6;
  if (useCachedScope) {
    frameObj = VarTo<Js::DynamicObject>(frameObj);
  }
  else {
    if (nonSimpleParamList) {
      bVar14 = VarIsImpl<Js::JavascriptGeneratorFunction>((RecyclableObject *)funcCallee);
      this = (GeneratorVirtualScriptFunction *)funcCallee;
      if (bVar14) {
        pJVar4 = UnsafeVarTo<Js::JavascriptGeneratorFunction,Js::JavascriptFunction>(funcCallee);
        this = (pJVar4->scriptFunction).ptr;
      }
      pFVar5 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
      if ((pFVar5->field_0x17b & 2) == 0) {
        type = PathTypeHandlerBase::CreateNewScopeObject<false>
                         (scriptContext,*(DynamicType **)((long)frameObj + 8),propIds,'G',0xffffffff
                         );
      }
      else {
        type = PathTypeHandlerBase::CreateNewScopeObject<true>
                         (scriptContext,*(DynamicType **)((long)frameObj + 8),propIds,'G',0xffffffff
                         );
      }
    }
    else {
      type = PathTypeHandlerBase::CreateNewScopeObject<false>
                       (scriptContext,*(DynamicType **)((long)frameObj + 8),propIds,'\0',0xffffffff)
      ;
    }
    newTypeHandler = (type->typeHandler).ptr;
    DynamicObject::EnsureSlots
              ((DynamicObject *)frameObj,
               *(int *)(*(long *)(*(long *)((long)frameObj + 8) + 0x28) + 0xc),
               newTypeHandler->slotCapacity,scriptContext,newTypeHandler);
    DynamicObject::ReplaceType((DynamicObject *)frameObj,type);
  }
  if (nonSimpleParamList && argsObj != (HeapArgumentsObject *)0x0) {
    pvVar6 = ConvertToUnmappedArguments
                       (argsObj,actualsCount,paramAddr,(DynamicObject *)frameObj,propIds,
                        formalsCount,scriptContext);
    return pvVar6;
  }
  if (actualsCount == 0) {
    bVar14 = true;
    uVar9 = 0;
  }
  else {
    uVar8 = actualsCount - 1;
    if (formalsCount - 1 < actualsCount - 1) {
      uVar8 = formalsCount - 1;
    }
    uVar9 = (ulong)(uVar8 + 1);
    uVar12 = 0;
    do {
      if (propIds == (PropertyIdArray *)0x0) {
        TVar11 = 0xffffffff;
      }
      else {
        TVar11 = (&propIds[1].count)[uVar12];
      }
      DynamicObject::SetSlot((DynamicObject *)frameObj,TVar11,false,(int)uVar12,paramAddr[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
    bVar14 = uVar12 < formalsCount;
  }
  if (!(bool)(bVar14 ^ 1U | formalsCount <= (uint)uVar9)) {
    pTVar13 = &propIds[1].count + uVar9;
    do {
      if (propIds == (PropertyIdArray *)0x0) {
        TVar11 = 0xffffffff;
      }
      else {
        TVar11 = *pTVar13;
      }
      DynamicObject::SetSlot
                ((DynamicObject *)frameObj,TVar11,false,(int)uVar9,
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr);
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
      pTVar13 = pTVar13 + 1;
    } while (formalsCount != uVar8);
  }
LAB_00ab9db6:
  if (argsObj == (HeapArgumentsObject *)0x0) {
    argsObj = (HeapArgumentsObject *)0x0;
  }
  else {
    if (formalsCount < actualsCount) {
      ppvVar10 = paramAddr + formalsCount;
      do {
        SetItem(argsObj,(RecyclableObject *)argsObj,formalsCount,*ppvVar10,scriptContext,
                PropertyOperation_None,1);
        formalsCount = formalsCount + 1;
        ppvVar10 = ppvVar10 + 1;
      } while (actualsCount != formalsCount);
    }
    BVar2 = JavascriptFunction::IsStrictMode(funcCallee);
    if (BVar2 != 0) {
      pEVar7 = HeapArgumentsObject::ConvertToUnmappedArgumentsObject(argsObj,!nonSimpleParamList);
      return pEVar7;
    }
  }
  return argsObj;
}

Assistant:

Var JavascriptOperators::FillScopeObject(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var frameObj, Var * paramAddr,
        Js::PropertyIdArray *propIds, HeapArgumentsObject * argsObj, ScriptContext * scriptContext, bool nonSimpleParamList, bool useCachedScope)
    {
        Assert(formalsCount == 0 || frameObj != nullptr);

        // Transfer formal arguments (that were actually passed) from their ArgIn slots to the local frame object.
        uint32 i;

        Var *tmpAddr = paramAddr;

        if (formalsCount != 0)
        {
            DynamicObject* frameObject = nullptr;
            if (useCachedScope)
            {
                frameObject = VarTo<DynamicObject>(frameObj);
                __analysis_assume((uint32)frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity() >= formalsCount);
            }
            else
            {
                frameObject = (DynamicObject*)frameObj;
                // No fixed fields for formal parameters of the arguments object.  Also, mark all fields as initialized up-front, because
                // we will set them directly using SetSlot below, so the type handler will not have a chance to mark them as initialized later.
                // CONSIDER : When we delay type sharing until the second instance is created, pass an argument indicating we want the types
                // and handlers created here to be marked as shared up-front. This is to ensure we don't get any fixed fields and that the handler
                // is ready for storing values directly to slots.
                DynamicType* newType = nullptr;
                if (nonSimpleParamList)
                {
                    bool skipLetAttrForArguments = ( VarIs<JavascriptGeneratorFunction>(funcCallee) ?
                        UnsafeVarTo<JavascriptGeneratorFunction>(funcCallee)->GetGeneratorVirtualScriptFunction()->GetFunctionBody()->HasReferenceableBuiltInArguments()
                        : funcCallee->GetFunctionBody()->HasReferenceableBuiltInArguments());

                    if (skipLetAttrForArguments)
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                    else
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                }
                else
                {
                    newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds);
                }
                int oldSlotCapacity = frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity();
                int newSlotCapacity = newType->GetTypeHandler()->GetSlotCapacity();
                __analysis_assume((uint32)newSlotCapacity >= formalsCount);

                frameObject->EnsureSlots(oldSlotCapacity, newSlotCapacity, scriptContext, newType->GetTypeHandler());
                frameObject->ReplaceType(newType);
            }

            if (argsObj && nonSimpleParamList)
            {
                return ConvertToUnmappedArguments(argsObj, actualsCount, paramAddr, frameObject, propIds, formalsCount, scriptContext);
            }

            for (i = 0; i < formalsCount && i < actualsCount; i++, tmpAddr++)
            {
                frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, *tmpAddr));
            }

            if (i < formalsCount)
            {
                // The formals that weren't passed still need to be put in the frame object so that
                // their names will be found. Initialize them to "undefined".
                for (; i < formalsCount; i++)
                {
                    frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, scriptContext->GetLibrary()->GetUndefined()));
                }
            }
        }

        if (argsObj != nullptr)
        {
            // Transfer the unnamed actual arguments, if any, to the Arguments object itself.
            for (i = formalsCount, tmpAddr = paramAddr + i; i < actualsCount; i++, tmpAddr++)
            {
                // ES5 10.6.11: use [[DefineOwnProperty]] semantics (instead of [[Put]]):
                // do not check whether property is non-writable/etc in the prototype.
                // ES3 semantics is same.
                JavascriptOperators::SetItem(argsObj, argsObj, i, *tmpAddr, scriptContext, PropertyOperation_None, /* skipPrototypeCheck = */ TRUE);
            }

            if (funcCallee->IsStrictMode())
            {
                // If the formals are let decls, then we just overwrote the frame object slots with
                // Undecl sentinels, and we can use the original arguments that were passed to the HeapArgumentsObject.
                return argsObj->ConvertToUnmappedArgumentsObject(!nonSimpleParamList);
            }
        }
        return argsObj;
    }